

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerSettings.cpp
# Opt level: O0

bool __thiscall
AsyncRgbLedAnalyzerSettings::SetSettingsFromInterfaces(AsyncRgbLedAnalyzerSettings *this)

{
  double dVar1;
  int index;
  Channel local_20 [16];
  AsyncRgbLedAnalyzerSettings *local_10;
  AsyncRgbLedAnalyzerSettings *this_local;
  
  local_10 = this;
  std::
  unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ::operator->(&this->mInputChannelInterface);
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::operator=(&this->mInputChannel,local_20);
  Channel::~Channel(local_20);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::operator->(&this->mControllerInterface);
  dVar1 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mLEDController = (int)dVar1;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel
            ((Channel *)this,(char *)&this->mInputChannel,SUB81(DEFAULT_CHANNEL_NAME,0));
  return true;
}

Assistant:

bool AsyncRgbLedAnalyzerSettings::SetSettingsFromInterfaces()
{
    mInputChannel = mInputChannelInterface->GetChannel();
    // explicit cast to keep MSVC happy
    const int index = static_cast<int>( mControllerInterface->GetNumber() );
    mLEDController = static_cast<Controller>( index );

    ClearChannels();
    AddChannel( mInputChannel, DEFAULT_CHANNEL_NAME, true );

    return true;
}